

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O3

void (anonymous_namespace)::randomize_container<std::array<unsigned_char,32ul>>
               (array<unsigned_char,_32UL> *container)

{
  uint uVar1;
  result_type rVar2;
  uint uVar3;
  long lVar4;
  uniform_int_distribution<unsigned_int> dist;
  default_random_engine eng;
  random_device rnd;
  param_type local_13b8;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_13b0;
  random_device local_13a8;
  
  local_13b8._M_a = 0;
  local_13b8._M_b = 0xff;
  std::random_device::random_device(&local_13a8);
  uVar1 = std::random_device::_M_getval();
  uVar3 = uVar1 / 0x7fffffff << 0x1f | uVar1 / 0x7fffffff;
  local_13b0._M_x = (unsigned_long)(uVar3 + uVar1 + (uint)(uVar1 + uVar3 == 0));
  lVar4 = 0;
  do {
    rVar2 = std::uniform_int_distribution<unsigned_int>::operator()
                      ((uniform_int_distribution<unsigned_int> *)&local_13b8,&local_13b0,&local_13b8
                      );
    container->_M_elems[lVar4] = (uchar)rVar2;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x20);
  std::random_device::_M_fini();
  return;
}

Assistant:

void randomize_container(C& container) {
    std::uniform_int_distribution<unsigned int> dist{
        0, std::numeric_limits<typename C::value_type>::max()};
    std::random_device rnd;
    std::default_random_engine eng(rnd());
    std::generate(container.begin(), container.end(), [&dist, &eng] { return dist(eng); });
  }